

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O2

void __thiscall
unitStringDefinitions_siDuplicates_Test::unitStringDefinitions_siDuplicates_Test
          (unitStringDefinitions_siDuplicates_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015df68;
  return;
}

Assistant:

TEST(unitStringDefinitions, siDuplicates)
{
    std::map<std::string, units::precise_unit> testMap;
    for (const auto& ustring : units::defined_unit_strings_si) {
        if (ustring.first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second) << "duplicate si unit string " << ustring.first;
    }
}